

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergePartialFromCodedStream
          (CodeGeneratorResponse_File *this,CodedInputStream *input)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  WireType WVar4;
  string *psVar5;
  char *pcVar6;
  UnknownFieldSet *unknown_fields;
  uint32 tag;
  CodedInputStream *input_local;
  CodeGeneratorResponse_File *this_local;
  uint32 local_30;
  
  do {
    while( true ) {
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ < 0x80)) {
        input->last_tag_ = (uint)*input->buffer_;
        io::CodedInputStream::Advance(input,1);
        local_30 = input->last_tag_;
      }
      else {
        uVar2 = io::CodedInputStream::ReadTagFallback(input);
        input->last_tag_ = uVar2;
        local_30 = input->last_tag_;
      }
      if (local_30 == 0) {
        return true;
      }
      iVar3 = internal::WireFormatLite::GetTagFieldNumber(local_30);
      if (iVar3 == 1) break;
      if (iVar3 == 2) {
        WVar4 = internal::WireFormatLite::GetTagWireType(local_30);
        if (WVar4 == WIRETYPE_LENGTH_DELIMITED) goto LAB_00246c8a;
      }
      else if ((iVar3 == 0xf) &&
              (WVar4 = internal::WireFormatLite::GetTagWireType(local_30),
              WVar4 == WIRETYPE_LENGTH_DELIMITED)) goto LAB_00246e02;
LAB_00246e88:
      WVar4 = internal::WireFormatLite::GetTagWireType(local_30);
      if (WVar4 == WIRETYPE_END_GROUP) {
        return true;
      }
      unknown_fields = mutable_unknown_fields(this);
      bVar1 = internal::WireFormat::SkipField(input,local_30,unknown_fields);
      if (!bVar1) {
        return false;
      }
    }
    WVar4 = internal::WireFormatLite::GetTagWireType(local_30);
    if (WVar4 != WIRETYPE_LENGTH_DELIMITED) goto LAB_00246e88;
    psVar5 = mutable_name_abi_cxx11_(this);
    bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
    if (!bVar1) {
      return false;
    }
    name_abi_cxx11_(this);
    pcVar6 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
    if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == '\x12')) {
      io::CodedInputStream::Advance(input,1);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
LAB_00246c8a:
      psVar5 = mutable_insertion_point_abi_cxx11_(this);
      bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
      if (!bVar1) {
        return false;
      }
      insertion_point_abi_cxx11_(this);
      pcVar6 = (char *)std::__cxx11::string::data();
      insertion_point_abi_cxx11_(this);
      iVar3 = std::__cxx11::string::length();
      internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
      if ((input->buffer_ < input->buffer_end_) && (*input->buffer_ == 'z')) {
        io::CodedInputStream::Advance(input,1);
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      if (bVar1) {
LAB_00246e02:
        psVar5 = mutable_content_abi_cxx11_(this);
        bVar1 = internal::WireFormatLite::ReadString(input,psVar5);
        if (!bVar1) {
          return false;
        }
        content_abi_cxx11_(this);
        pcVar6 = (char *)std::__cxx11::string::data();
        content_abi_cxx11_(this);
        iVar3 = std::__cxx11::string::length();
        internal::WireFormat::VerifyUTF8String(pcVar6,iVar3,PARSE);
        bVar1 = io::CodedInputStream::ExpectAtEnd(input);
        if (bVar1) {
          return true;
        }
      }
    }
  } while( true );
}

Assistant:

bool CodeGeneratorResponse_File::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!(EXPRESSION)) return false
  ::google::protobuf::uint32 tag;
  while ((tag = input->ReadTag()) != 0) {
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string name = 1;
      case 1: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_name()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->name().data(), this->name().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(18)) goto parse_insertion_point;
        break;
      }

      // optional string insertion_point = 2;
      case 2: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_insertion_point:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_insertion_point()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->insertion_point().data(), this->insertion_point().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectTag(122)) goto parse_content;
        break;
      }

      // optional string content = 15;
      case 15: {
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
         parse_content:
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_content()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8String(
            this->content().data(), this->content().length(),
            ::google::protobuf::internal::WireFormat::PARSE);
        } else {
          goto handle_uninterpreted;
        }
        if (input->ExpectAtEnd()) return true;
        break;
      }

      default: {
      handle_uninterpreted:
        if (::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          return true;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
  return true;
#undef DO_
}